

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O0

exr_result_t
exr_attr_opaquedata_copy(exr_context_t ctxt,exr_attr_opaquedata_t *ud,exr_attr_opaquedata_t *srcud)

{
  size_t in_RDX;
  exr_attr_opaquedata_t *in_RSI;
  exr_attr_opaquedata_t *in_RDI;
  exr_result_t rv;
  exr_attr_opaquedata_t *in_stack_00000020;
  exr_context_t in_stack_00000028;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar1;
  
  if (in_RDX == 0) {
    eVar1 = 3;
  }
  else if (*(long *)(in_RDX + 0x10) == 0) {
    eVar1 = exr_attr_opaquedata_init(in_stack_00000028,in_stack_00000020,(size_t)ctxt);
    if (eVar1 == 0) {
      eVar1 = exr_attr_opaquedata_set_unpacked
                        ((exr_context_t)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI
                         ,(int32_t)(in_RDX >> 0x20));
    }
  }
  else {
    eVar1 = exr_attr_opaquedata_create
                      ((exr_context_t)in_RDI,in_RSI,in_RDX,
                       (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_opaquedata_copy (
    exr_context_t                ctxt,
    exr_attr_opaquedata_t*       ud,
    const exr_attr_opaquedata_t* srcud)
{
    exr_result_t rv;
    if (!srcud) return EXR_ERR_INVALID_ARGUMENT;
    if (srcud->packed_data)
        return exr_attr_opaquedata_create (
            ctxt, ud, (size_t) srcud->size, srcud->packed_data);
    rv = exr_attr_opaquedata_init (ctxt, ud, 0);
    if (rv == EXR_ERR_SUCCESS)
        rv = exr_attr_opaquedata_set_unpacked (
            ctxt, ud, srcud->unpacked_data, srcud->unpacked_size);
    return rv;
}